

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeIf(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  bool bVar2;
  uint32_t uVar3;
  Expression *pEVar4;
  Type TVar5;
  Type type_00;
  ThreeArgs local_48;
  
  pEVar4 = makeCondition(this);
  local_48.a = (Expression *)0x0;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->hangStack,&local_48.a);
  if (type.id == 0) {
    bVar2 = Random::oneIn(&this->random,2);
    if (bVar2) {
      local_48.a = pEVar4;
      local_48.b = makeMaybeBlock(this,(Type)0x0);
      local_48.c = (Expression *)0x0;
      type.id = 0;
      goto LAB_001614ce;
    }
  }
  uVar3 = Random::upTo(&this->random,0x14);
  TVar5.id = type.id;
  if (uVar3 == 1) {
    type_00.id = 1;
  }
  else {
    type_00.id = type.id;
    if (uVar3 == 0) {
      TVar5.id = 1;
    }
  }
  local_48.a = pEVar4;
  local_48.b = makeMaybeBlock(this,TVar5);
  local_48.c = makeMaybeBlock(this,type_00);
LAB_001614ce:
  pEVar4 = buildIf(this,&local_48,type);
  pppEVar1 = &(this->funcContext->hangStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeIf(Type type) {
  auto* condition = makeCondition();
  funcContext->hangStack.push_back(nullptr);

  Expression* ret;
  if (type == Type::none && oneIn(2)) {
    // Just an ifTrue arm.
    ret = buildIf({condition, makeMaybeBlock(type), nullptr}, type);
  } else {
    // Also an ifFalse arm.

    // Some of the time make one arm unreachable (but not both, as then the if
    // as a whole would be unreachable).
    auto trueType = type;
    auto falseType = type;
    switch (upTo(20)) {
      case 0:
        trueType = Type::unreachable;
        break;
      case 1:
        falseType = Type::unreachable;
        break;
    }
    ret = buildIf(
      {condition, makeMaybeBlock(trueType), makeMaybeBlock(falseType)}, type);
  }

  funcContext->hangStack.pop_back();
  return ret;
}